

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureLdFldInlinee
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> **ppWVar7;
  Recycler *pRVar8;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *ptr;
  FunctionCodeGenRuntimeData **ppFVar9;
  FunctionCodeGenRuntimeData *this_00;
  WriteBarrierPtr *this_01;
  TrackAllocData local_98;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_70;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> inlineeData;
  TrackAllocData local_58;
  FunctionBody *local_30;
  FunctionBody *inlinee_local;
  Recycler *pRStack_20;
  InlineCacheIndex inlineCacheIndex_local;
  Recycler *recycler_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_30 = inlinee;
  inlinee_local._4_4_ = inlineCacheIndex;
  pRStack_20 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xac,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._4_4_;
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
  uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
  if (uVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xad,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_30 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xae,"(inlinee)","inlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->ldFldInlinees);
  pRVar8 = pRStack_20;
  if (*ppWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo,0,
               (ulong)uVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
               ,0xb2);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_58);
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
    inlineeData.ptr = (FunctionCodeGenRuntimeData *)Memory::Recycler::AllocZero;
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::operator=
              (&this->ldFldInlinees,ptr);
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->ldFldInlinees);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            (&local_70,*ppWVar7 + inlinee_local._4_4_);
  ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                      ((WriteBarrierPtr *)&local_70);
  pRVar8 = pRStack_20;
  if (*ppFVar9 == (FunctionCodeGenRuntimeData *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
               ,0xb7);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_98);
    this_00 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar8,0x43c4b0);
    FunctionCodeGenRuntimeData(this_00,local_30);
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->ldFldInlinees);
    this_01 = (WriteBarrierPtr *)
              Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator=
                        (*ppWVar7 + inlinee_local._4_4_,this_00);
    ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__(this_01);
    this_local = *ppFVar9;
  }
  else {
    ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)&local_70);
    this_local = *ppFVar9;
  }
  return this_local;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::EnsureLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetInlineCacheCount());
        }
        const auto inlineeData = ldFldInlinees[inlineCacheIndex];
        if (!inlineeData)
        {
            return ldFldInlinees[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        }
        return inlineeData;
    }